

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSession.cpp
# Opt level: O1

void __thiscall
ki::protocol::net::ServerSession::on_control_message(ServerSession *this,PacketHeader *header)

{
  uint8_t uVar1;
  
  uVar1 = PacketHeader::get_opcode(header);
  if (uVar1 == '\x03') {
    on_keep_alive(this);
    return;
  }
  if (uVar1 != '\x04') {
    if (uVar1 == '\x05') {
      on_session_accept(this);
      return;
    }
    (**(code **)(*(long *)((long)&this->_vptr_ServerSession + (long)this->_vptr_ServerSession[-3]) +
                0x38))((_func_int *)
                       ((long)&this->_vptr_ServerSession + (long)this->_vptr_ServerSession[-3]),4);
    return;
  }
  on_keep_alive_response(this);
  return;
}

Assistant:

void ServerSession::on_control_message(const PacketHeader& header)
	{
		switch ((control::Opcode)header.get_opcode())
		{
		case control::Opcode::SESSION_ACCEPT:
			on_session_accept();
			break;

		case control::Opcode::KEEP_ALIVE:
			on_keep_alive();
			break;

		case control::Opcode::KEEP_ALIVE_RSP:
			on_keep_alive_response();
			break;

		default:
			close(SessionCloseErrorCode::UNHANDLED_CONTROL_MESSAGE);
			break;
		}
	}